

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_setupvalt(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  ushort uVar1;
  GCObject *pGVar2;
  UpVal *pUVar3;
  TValue *pTVar4;
  
  if (ra->tt_ != 0x8005) {
    luaG_runerror(L,"upvalue of table type, cannot be set to non table value");
  }
  pGVar2 = (ra->value_).gc;
  pUVar3 = cl->upvals[b];
  pTVar4 = pUVar3->v;
  (pTVar4->value_).gc = pGVar2;
  uVar1 = ra->tt_;
  pTVar4->tt_ = uVar1;
  if ((short)uVar1 < 0) {
    if (((uVar1 & 0x7f) != (ushort)pGVar2->tt) ||
       ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbd1,"void raviV_op_setupvalt(lua_State *, LClosure *, TValue *, int)");
    }
    if (pUVar3->v == (TValue *)&pUVar3->u) {
      luaC_upvalbarrier_(L,(ra->value_).gc);
      return;
    }
  }
  return;
}

Assistant:

void raviV_op_setupvalt(lua_State *L, LClosure *cl, TValue *ra, int b) {
  if (!ttisLtable(ra))
    luaG_runerror(L, "upvalue of table type, cannot be set to non table value");
  UpVal *uv = cl->upvals[b];
  setobj(L, uv->v, ra);
  luaC_upvalbarrier(L, uv, ra);
}